

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

bool __thiscall QGraphicsProxyWidget::focusNextPrevChild(QGraphicsProxyWidget *this,bool next)

{
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QWidget *pQVar3;
  
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar1 = (this_00->widget).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      (pQVar3 = (QWidget *)(this_00->widget).wp.value, pQVar3 != (QWidget *)0x0)) &&
     ((this_00->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.scene !=
      (QGraphicsScene *)0x0)) {
    pQVar3 = QWidget::focusWidget(pQVar3);
    pQVar3 = QGraphicsProxyWidgetPrivate::findFocusChild(this_00,pQVar3,next);
    if (pQVar3 != (QWidget *)0x0) {
      QWidget::setFocus(pQVar3,BacktabFocusReason - next);
      return true;
    }
  }
  bVar2 = QGraphicsWidget::focusNextPrevChild((QGraphicsWidget *)this,next);
  return bVar2;
}

Assistant:

bool QGraphicsProxyWidget::focusNextPrevChild(bool next)
{
    Q_D(QGraphicsProxyWidget);
    if (!d->widget || !d->scene)
        return QGraphicsWidget::focusNextPrevChild(next);

    Qt::FocusReason reason = next ? Qt::TabFocusReason : Qt::BacktabFocusReason;
    QWidget *lastFocusChild = d->widget->focusWidget();
    if (QWidget *newFocusChild = d->findFocusChild(lastFocusChild, next)) {
        newFocusChild->setFocus(reason);
        return true;
    }

    return QGraphicsWidget::focusNextPrevChild(next);
}